

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O3

Flow __thiscall Dinic::blocking(Dinic *this,int a,Flow val)

{
  uint uVar1;
  int a_00;
  pointer piVar2;
  pointer pEVar3;
  pointer piVar4;
  pointer pEVar5;
  Flow FVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  pointer pvVar10;
  
  if ((val != 0) && (this->T != a)) {
    pvVar10 = (this->g).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    piVar2 = (this->pt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = piVar2[a];
    uVar8 = (ulong)iVar7;
    lVar9 = *(long *)&pvVar10[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if (uVar8 < (ulong)((long)*(pointer *)
                               ((long)&pvVar10[a].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) - lVar9 >> 2)) {
      do {
        uVar1 = *(uint *)(lVar9 + uVar8 * 4);
        pEVar3 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->d).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        a_00 = pEVar3[(int)uVar1].b;
        if (piVar4[a_00] == piVar4[a] + 1) {
          pEVar3 = pEVar3 + (int)uVar1;
          lVar9 = pEVar3->cap - pEVar3->flow;
          if (val <= lVar9) {
            lVar9 = val;
          }
          FVar6 = blocking(this,a_00,lVar9);
          if (FVar6 != 0) {
            pEVar5 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pEVar3 = pEVar5 + (int)uVar1;
            pEVar3->flow = pEVar3->flow + FVar6;
            pEVar5 = pEVar5 + (int)(uVar1 ^ 1);
            pEVar5->flow = pEVar5->flow - FVar6;
            return FVar6;
          }
          iVar7 = piVar2[a];
          pvVar10 = (this->g).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        iVar7 = iVar7 + 1;
        piVar2[a] = iVar7;
        uVar8 = (ulong)iVar7;
        lVar9 = *(long *)&pvVar10[a].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
      } while (uVar8 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar10[a].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 8) - lVar9 >> 2));
    }
    val = 0;
  }
  return val;
}

Assistant:

Flow blocking(int a, Flow val) {
        if (a == T || val == 0) return val;
        for (int &i = pt[a]; i < g[a].size(); i++) {
            int x = g[a][i];
            int b = e[x].b;
            if (d[b] == d[a] + 1) {
                if (Flow added = blocking(b, min(val, e[x].unused()))) {
                    e[x].flow += added;
                    e[x ^ 1].flow -= added;
                    return added;
                }
            }
        }
        return 0;
    }